

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  undefined8 uVar1;
  int iVar2;
  pointer pdVar3;
  Nonzero<double> *pNVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  ulong uStack_d0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  ulong uStack_40;
  
  iVar8 = this->m_j;
  iVar2 = this->m_old_j;
  if (iVar8 != iVar2) {
    pdVar3 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar8];
    pdVar3 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar2] = pdVar3[iVar8];
    cStatus->data[iVar2] = cStatus->data[iVar8];
  }
  pNVar4 = (this->m_row).super_SVectorBase<double>.m_elem;
  if ((pNVar4 != (Nonzero<double> *)0x0) &&
     (lVar11 = (long)(this->m_row).super_SVectorBase<double>.memused, 0 < lVar11)) {
    lVar12 = 0;
    do {
      if (*(int *)((long)&pNVar4->idx + lVar12) == iVar8) {
        uVar1 = *(undefined8 *)((long)&pNVar4->val + lVar12);
        uVar14 = (undefined4)uVar1;
        uVar16 = (undefined4)((ulong)uVar1 >> 0x20);
        goto LAB_001fc352;
      }
      lVar12 = lVar12 + 0x10;
    } while (lVar11 * 0x10 != lVar12);
  }
  uVar14 = 0;
  uVar16 = 0;
LAB_001fc352:
  iVar8 = this->m_i;
  pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar25 = pdVar3[iVar8];
  if (ABS(dVar25) <= 1e-06) {
    pdVar3[iVar8] = 0.0;
    uVar15 = 0;
    uVar17 = 0;
  }
  else {
    ::soplex::infinity::__tls_init();
    if (*(double *)(in_FS_OFFSET + -8) <= dVar25) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Simplifier: infinite activities - aborting unsimplification",
                 "");
      *puVar10 = &PTR__SPxException_0069d438;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_a8,local_a8 + local_a0);
      __cxa_throw(puVar10,&SPxException::typeinfo,SPxException::~SPxException);
    }
    iVar8 = this->m_i;
    dVar25 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar8];
    uVar15 = SUB84(dVar25,0);
    uVar17 = (undefined4)((ulong)dVar25 >> 0x20);
  }
  auVar19._0_8_ = ABS(this->m_lhs);
  auVar19._8_8_ = ABS(this->m_rhs);
  auVar22._0_8_ = CONCAT44(uVar17,uVar15) & 0x7fffffffffffffff;
  auVar22._8_8_ = CONCAT44(uVar17,uVar15) & 0x7fffffffffffffff;
  auVar19 = maxpd(auVar19,auVar22);
  dVar25 = auVar19._8_8_;
  auVar23._8_8_ = -(ulong)(dVar25 < 1.0);
  auVar23._0_8_ = -(ulong)(auVar19._0_8_ < 1.0);
  uVar9 = movmskpd(iVar8,auVar23);
  local_88 = 1.0;
  dStack_80 = 0.0;
  if ((uVar9 & 1) == 0) {
    local_88 = auVar19._0_8_;
    dStack_80 = dVar25;
  }
  dVar18 = 1.0;
  if ((uVar9 & 2) == 0) {
    dVar18 = dVar25;
  }
  auVar26._12_4_ = uVar17;
  auVar26._8_4_ = uVar15;
  auVar26._0_8_ = this->m_lhs;
  auVar20._8_8_ = local_88;
  auVar20._0_8_ = local_88;
  auVar19 = divpd(auVar26,auVar20);
  dVar21 = auVar19._8_8_;
  dVar25 = auVar19._0_8_ - dVar21;
  auVar24._12_4_ = uVar17;
  auVar24._8_4_ = uVar15;
  auVar24._0_8_ = this->m_rhs;
  auVar5._8_4_ = SUB84(dVar18,0);
  auVar5._0_8_ = dVar18;
  auVar5._12_4_ = (int)((ulong)dVar18 >> 0x20);
  auVar19 = divpd(auVar24,auVar5);
  dStack_70 = auVar19._8_8_;
  local_78 = auVar19._0_8_ - dStack_70;
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  dStack_70 = (double)(~(ulong)ABS(dStack_70) & (ulong)dStack_70);
  dVar25 = (double)(~-(ulong)(ABS(dVar25) <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) &
                   (ulong)dVar25) * local_88;
  auVar6._8_4_ = (int)(~(ulong)ABS(dVar21) & (ulong)dVar21);
  auVar6._0_8_ = dVar25;
  auVar6._12_4_ = (int)((~(ulong)ABS(dVar21) & (ulong)dVar21) >> 0x20);
  local_78 = (double)(~-(ulong)(ABS(local_78) <=
                               (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) &
                     (ulong)local_78) * dVar18;
  uStack_d0 = auVar6._8_8_;
  local_88 = local_78;
  dStack_80 = dStack_70;
  if (0.0 < (double)CONCAT44(uVar16,uVar14)) {
    local_88 = dVar25;
    dStack_80 = (double)uStack_d0;
  }
  (*(this->super_PostStep)._vptr_PostStep[6])(this);
  (*(this->super_PostStep)._vptr_PostStep[6])(this);
  switch(rStatus->data[this->m_i]) {
  case ON_UPPER:
    dVar25 = this->m_lower;
    ::soplex::infinity::__tls_init();
    dVar18 = *(double *)(in_FS_OFFSET + -8);
    if ((-dVar18 < dVar25) ||
       (dVar25 = this->m_upper, ::soplex::infinity::__tls_init(), dVar25 < dVar18)) {
      dVar18 = this->m_lower;
      dVar25 = this->m_upper;
      if ((dVar18 != dVar25) || (NAN(dVar18) || NAN(dVar25))) {
        if (0.0 < (double)CONCAT44(uVar16,uVar14)) {
          lVar11 = (long)this->m_j;
          (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] = dVar18;
          cStatus->data[lVar11] = ON_LOWER;
          dVar25 = dVar18;
        }
        else {
          if (0.0 <= (double)CONCAT44(uVar16,uVar14)) {
            puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_a8 = local_98;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"XMAISM02 This should never happen.","");
            *puVar10 = &PTR__SPxException_0069d438;
            puVar10[1] = puVar10 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar10 + 1),local_a8,local_a8 + local_a0);
            *puVar10 = &PTR__SPxException_0069d410;
            __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          lVar11 = (long)this->m_j;
          (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] = dVar25;
          cStatus->data[lVar11] = ON_UPPER;
        }
        goto LAB_001fcbc8;
      }
LAB_001fca52:
      dVar25 = dVar18;
      lVar11 = (long)this->m_j;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = dVar25;
      cStatus->data[lVar11] = FIXED;
      goto LAB_001fcbc8;
    }
    break;
  case ON_LOWER:
    dVar25 = this->m_lower;
    ::soplex::infinity::__tls_init();
    dVar18 = *(double *)(in_FS_OFFSET + -8);
    if ((-dVar18 < dVar25) ||
       (dVar25 = this->m_upper, ::soplex::infinity::__tls_init(), dVar25 < dVar18)) {
      dVar18 = this->m_lower;
      dVar25 = this->m_upper;
      if ((dVar18 != dVar25) || (NAN(dVar18) || NAN(dVar25))) {
        if ((double)CONCAT44(uVar16,uVar14) <= 0.0) {
          if (0.0 <= (double)CONCAT44(uVar16,uVar14)) {
            puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_a8 = local_98;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"XMAISM01 This should never happen.","");
            *puVar10 = &PTR__SPxException_0069d438;
            puVar10[1] = puVar10 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar10 + 1),local_a8,local_a8 + local_a0);
            *puVar10 = &PTR__SPxException_0069d410;
            __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          lVar11 = (long)this->m_j;
          (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] = dVar18;
          cStatus->data[lVar11] = ON_LOWER;
          dVar25 = dVar18;
        }
        else {
          lVar11 = (long)this->m_j;
          (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] = dVar25;
          cStatus->data[lVar11] = ON_UPPER;
        }
        goto LAB_001fcbc8;
      }
      goto LAB_001fca52;
    }
    break;
  case FIXED:
    dVar25 = this->m_lower;
    ::soplex::infinity::__tls_init();
    dVar18 = *(double *)(in_FS_OFFSET + -8);
    if ((-dVar18 < dVar25) ||
       (dVar25 = this->m_upper, ::soplex::infinity::__tls_init(), dVar25 < dVar18)) {
      dVar25 = (this->m_lower + this->m_upper) * 0.5;
      lVar11 = (long)this->m_j;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = dVar25;
      cStatus->data[lVar11] = FIXED;
    }
    else {
      lVar11 = (long)this->m_j;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = 0.0;
      cStatus->data[lVar11] = ZERO;
      dVar25 = 0.0;
    }
    goto LAB_001fcbc8;
  default:
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"XMAISM04 This should never happen.","");
    *puVar10 = &PTR__SPxException_0069d438;
    puVar10[1] = puVar10 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar10 + 1),local_a8,local_a8 + local_a0);
    *puVar10 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case BASIC:
    local_60 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
    local_88 = local_88 / (double)CONCAT44(uVar16,uVar14);
    local_48 = ABS(local_88);
    uStack_40 = (ulong)dStack_80 & 0x7fffffffffffffff;
    local_88 = (double)(~-(ulong)(local_48 <=
                                 (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)) &
                       (ulong)local_88);
    dStack_80 = (double)(~uStack_40 & (ulong)dStack_80);
    local_58 = this->m_lower;
    uStack_50 = 0;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    dVar21 = (double)(~-(ulong)(local_48 <=
                               (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)) &
                     (ulong)local_48);
    dVar18 = ABS(local_58);
    if (ABS(local_58) <= dVar21) {
      dVar18 = dVar21;
    }
    if (dVar18 <= 1.0) {
      dVar18 = 1.0;
    }
    if (((local_58 - local_88) / dVar18 <=
         -(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03)) ||
       (dVar18 = this->m_lower, ::soplex::infinity::__tls_init(),
       dVar18 <= -*(double *)(in_FS_OFFSET + -8))) {
      uVar13 = -(ulong)((double)CONCAT44(uVar16,uVar14) <= 0.0);
      dVar21 = (double)(~uVar13 & (ulong)local_78 | (ulong)dVar25 & uVar13) /
               (double)CONCAT44(uVar16,uVar14);
      dVar25 = ABS(dVar21);
      dVar21 = (double)(~-(ulong)(dVar25 <= local_60) & (ulong)dVar21);
      local_78 = this->m_upper;
      dStack_70 = 0.0;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      dVar25 = (double)(~-(ulong)(dVar25 <= local_60) & (ulong)dVar25);
      dVar18 = ABS(local_78);
      if (ABS(local_78) <= dVar25) {
        dVar18 = dVar25;
      }
      if (dVar18 <= 1.0) {
        dVar18 = 1.0;
      }
      if (((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04) < (local_78 - dVar21) / dVar18)
         || (dVar25 = this->m_upper, ::soplex::infinity::__tls_init(),
            *(double *)(in_FS_OFFSET + -8) <= dVar25)) {
        ::soplex::infinity::__tls_init();
        dVar25 = *(double *)(in_FS_OFFSET + -8);
        if (local_88 <= -dVar25) {
          ::soplex::infinity::__tls_init();
          if (dVar25 <= dVar21) {
            puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_a8 = local_98;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"XMAISM03 This should never happen.","");
            *puVar10 = &PTR__SPxException_0069d438;
            puVar10[1] = puVar10 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar10 + 1),local_a8,local_a8 + local_a0);
            *puVar10 = &PTR__SPxException_0069d410;
            __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          bVar7 = (double)CONCAT44(uVar16,uVar14) <= 0.0;
          local_88 = dVar21;
        }
        else {
          bVar7 = 0.0 < (double)CONCAT44(uVar16,uVar14);
        }
        lVar11 = (long)this->m_j;
        (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar11] = local_88;
        cStatus->data[lVar11] = BASIC;
        rStatus->data[this->m_i] = (uint)bVar7;
        dVar25 = local_88;
      }
      else {
        dVar25 = this->m_upper;
        lVar11 = (long)this->m_j;
        (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar11] = dVar25;
        cStatus->data[lVar11] = (-(uint)(this->m_lower == dVar25) & 1) * 2;
      }
    }
    else {
      dVar25 = this->m_lower;
      lVar11 = (long)this->m_j;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = dVar25;
      cStatus->data[lVar11] = (this->m_upper == dVar25) + ON_LOWER;
    }
    goto LAB_001fcbc8;
  }
  lVar11 = (long)this->m_j;
  (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar11] = 0.0;
  cStatus->data[lVar11] = ZERO;
  dVar25 = 0.0;
LAB_001fcbc8:
  iVar8 = this->m_i;
  pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3[iVar8] = dVar25 * (double)CONCAT44(uVar16,uVar14) + pdVar3[iVar8];
  (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar11] =
       -(double)CONCAT44(uVar16,uVar14) *
       (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar8];
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}